

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_output_mode(args_t *this,char *str)

{
  int iVar1;
  
  iVar1 = strcmp(str,"json");
  if (iVar1 == 0) {
    this->output_mode = json;
  }
  else {
    iVar1 = strcmp(str,"files");
    if (iVar1 != 0) {
      ERROR("invalid output format mode type: %s",str);
      return;
    }
    this->output_mode = files;
  }
  return;
}

Assistant:

void args_t::parse_output_mode( const char * str ) {
        if (!strcmp (str, "json")) {
            output_mode = json;
        } else if (!strcmp (str, "files")) {
            output_mode = files;
        } else  {
            ERROR( "invalid output format mode type: %s", str );
        }
    }